

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testutil.h
# Opt level: O2

void test_close_impl(char *file,int line,int sock)

{
  uint errnum;
  FILE *__stream;
  int iVar1;
  uint *puVar2;
  char *pcVar3;
  undefined4 in_register_00000014;
  undefined4 in_register_00000034;
  
  iVar1 = nn_close(line,CONCAT44(in_register_00000034,line),CONCAT44(in_register_00000014,sock));
  if (iVar1 != 0) {
    puVar2 = (uint *)__errno_location();
    __stream = _stderr;
    errnum = *puVar2;
    if ((errnum != 9) && (errnum != 0x9523dfd)) {
      pcVar3 = nn_err_strerror(errnum);
      fprintf(__stream,"Failed to close socket: %s [%d] (%s:%d)\n",pcVar3,(ulong)*puVar2,
              "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/inproc_shutdown.c"
              ,(ulong)file & 0xffffffff);
      nn_err_abort();
    }
  }
  return;
}

Assistant:

static void NN_UNUSED test_close_impl (char *file, int line, int sock)
{
    int rc;

    rc = nn_close (sock);
    if ((rc != 0) && (errno != EBADF && errno != ETERM)) {
        fprintf (stderr, "Failed to close socket: %s [%d] (%s:%d)\n",
            nn_err_strerror (errno),
            (int) errno, file, line);
        nn_err_abort ();
    }
}